

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

value_type * __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
::FindAndConstruct(DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                   *this,KeyID *Key)

{
  bool bVar1;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *ConstFoundBucket;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *local_20;
  
  bVar1 = LookupBucketFor<llbuild::core::KeyID>(this,Key,&local_20);
  if (!bVar1) {
    local_20 = InsertIntoBucketImpl<llbuild::core::KeyID>(this,Key,Key,local_20);
    (local_20->super_pair<llbuild::core::KeyID,_DBKeyID>).first._value = Key->_value;
    (local_20->super_pair<llbuild::core::KeyID,_DBKeyID>).second.value = 0;
  }
  return local_20;
}

Assistant:

value_type& FindAndConstruct(const KeyT &Key) {
    BucketT *TheBucket;
    if (LookupBucketFor(Key, TheBucket))
      return *TheBucket;

    return *InsertIntoBucket(TheBucket, Key);
  }